

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_last_of(StringRef *this,StringRef Chars,size_t From)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_type i;
  size_t Index;
  undefined1 auStack_68 [8];
  bitset<256UL> CharBits;
  StringRef Chars_local;
  
  CharBits.super__Base_bitset<4UL>._M_w[3] = (_WordT)Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[1] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[2] = 0;
  auStack_68 = (undefined1  [8])0x0;
  CharBits.super__Base_bitset<4UL>._M_w[0] = 0;
  for (Index = 0; Index != Chars.Length; Index = Index + 1) {
    bVar1 = operator[]((StringRef *)(CharBits.super__Base_bitset<4UL>._M_w + 3),Index);
    std::bitset<256UL>::set((bitset<256UL> *)auStack_68,(ulong)bVar1,true);
  }
  if (this->Length < From) {
    From = this->Length;
  }
  do {
    uVar3 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    bVar2 = std::bitset<256UL>::test((bitset<256UL> *)auStack_68,(ulong)(byte)this->Data[From - 1]);
    From = uVar3;
  } while (!bVar2);
  return uVar3;
}

Assistant:

StringRef::size_type StringRef::find_last_of(StringRef Chars,
                                             size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length) - 1, e = -1; i != e; --i)
    if (CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}